

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.hpp
# Opt level: O0

void __thiscall rest_rpc::rpc_client::do_read(rpc_client *this)

{
  rpc_client *in_stack_00000008;
  
  async_read_head<rest_rpc::rpc_client::do_read()::_lambda(std::error_code_const&,unsigned_long)_1_>
            (in_stack_00000008,(anon_class_8_1_8991fb9c_for_handler_)this);
  return;
}

Assistant:

void do_read() {
    async_read_head([this](const asio::error_code &ec, const size_t length) {
      if (!socket_.is_open()) {
        // LOG(INFO) << "socket already closed";
        has_connected_ = false;
        return;
      }

      if (!ec) {
        // const uint32_t body_len = *((uint32_t*)(head_));
        // auto req_id = *((std::uint64_t*)(head_ + sizeof(int32_t)));
        // auto req_type = *(request_type*)(head_ + sizeof(int32_t) +
        // sizeof(int64_t));
        rpc_header *header = (rpc_header *)(head_);
        const uint32_t body_len = header->body_len;
        if (body_len > 0 && body_len < MAX_BUF_LEN) {
          if (body_.size() < body_len) {
            body_.resize(body_len);
          }
          read_body(header->req_id, header->req_type, body_len);
          return;
        }

        if (body_len == 0 || body_len > MAX_BUF_LEN) {
          // LOG(INFO) << "invalid body len";
          close();
          error_callback(
              asio::error::make_error_code(asio::error::message_size));
          return;
        }
      } else {
        std::cout << ec.message() << "\n";

        {
          std::unique_lock<std::mutex> lock(cb_mtx_);
          for (auto &item : callback_map_) {
            item.second->callback(ec, {});
          }
        }

        close(false);
        error_callback(ec);
      }
    });
  }